

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctx.c
# Opt level: O2

void chirc_ctx_init(chirc_ctx_t *ctx)

{
  sds pcVar1;
  time_t t;
  time_t local_18;
  
  local_18 = time((time_t *)0x0);
  ctx->connections = (chirc_connection_t *)0x0;
  (ctx->network).this_server = (chirc_server_t *)0x0;
  (ctx->network).servers = (chirc_server_t *)0x0;
  ctx->channels = (chirc_channel_t *)0x0;
  ctx->users = (chirc_user_t *)0x0;
  pcVar1 = sdsnew("chirc-0.6.0");
  ctx->version = pcVar1;
  localtime_r(&local_18,(tm *)&ctx->created);
  return;
}

Assistant:

void chirc_ctx_init(chirc_ctx_t *ctx)
{
    time_t t = time(NULL);

    ctx->channels = NULL;

    ctx->users = NULL;

    ctx->connections = NULL;

    ctx->network.this_server = NULL;
    ctx->network.servers = NULL;

    ctx->version = sdsnew(VERSION);
    localtime_r(&t, &ctx->created);
}